

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::Sticker::Sticker
          (Sticker *this,field<discordpp::Snowflake> *id,
          omittable_field<discordpp::Snowflake> *pack_id,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *description,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *tags,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *asset,field<int> *type,field<int> *format_type,omittable_field<bool> *available,
          omittable_field<discordpp::Snowflake> *guild_id,omittable_field<discordpp::User> *user,
          omittable_field<int> *sort_value)

{
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tags_local;
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  omittable_field<discordpp::Snowflake> *pack_id_local;
  field<discordpp::Snowflake> *id_local;
  Sticker *this_local;
  
  field<discordpp::Snowflake>::field(&this->id,id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->pack_id,pack_id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,name);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->description,description);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->tags,tags);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->asset,asset);
  field<int>::field(&this->type,type);
  field<int>::field(&this->format_type,format_type);
  omittable_field<bool>::omittable_field(&this->available,available);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id,guild_id);
  omittable_field<discordpp::User>::omittable_field(&this->user,user);
  omittable_field<int>::omittable_field(&this->sort_value,sort_value);
  return;
}

Assistant:

Sticker(
        field<Snowflake> id = uninitialized,
        omittable_field<Snowflake> pack_id = omitted,
        field<std::string> name = uninitialized,
        nullable_field<std::string> description = uninitialized,
        field<std::string> tags = uninitialized,
        omittable_field<std::string> asset = omitted,
        field<int> type = uninitialized,
        field<int> format_type = uninitialized,
        omittable_field<bool> available = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<User> user = omitted,
        omittable_field<int> sort_value = omitted
    ):
        id(id),
        pack_id(pack_id),
        name(name),
        description(description),
        tags(tags),
        asset(asset),
        type(type),
        format_type(format_type),
        available(available),
        guild_id(guild_id),
        user(user),
        sort_value(sort_value)
    {}